

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fq.cpp
# Opt level: O3

bool __thiscall zmq::fq_t::has_in(fq_t *this)

{
  size_type sVar1;
  pointer pppVar2;
  size_type sVar3;
  pipe_t *ppVar4;
  pipe_t *ppVar5;
  bool bVar6;
  size_type sVar7;
  pipe_t *__tmp;
  
  bVar6 = true;
  if (this->_more == false) {
    if (this->_active == 0) {
      bVar6 = false;
    }
    else {
      sVar7 = this->_current;
      do {
        bVar6 = pipe_t::check_read((this->_pipes)._items.
                                   super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[sVar7]);
        if (bVar6) {
          return bVar6;
        }
        pppVar2 = (this->_pipes)._items.
                  super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar3 = this->_active;
        sVar1 = sVar3 - 1;
        this->_active = sVar1;
        sVar7 = this->_current;
        ppVar4 = pppVar2[sVar7];
        if (ppVar4 != (pipe_t *)0x0) {
          *(int *)((long)&ppVar4->super_array_item_t<1> + 8) = (int)sVar1;
        }
        ppVar5 = pppVar2[sVar3 + 0xffffffffffffffff];
        if (ppVar5 != (pipe_t *)0x0) {
          *(int *)((long)&ppVar5->super_array_item_t<1> + 8) = (int)sVar7;
        }
        pppVar2[sVar7] = ppVar5;
        pppVar2[sVar3 + 0xffffffffffffffff] = ppVar4;
        if (sVar7 == sVar1) {
          this->_current = 0;
          sVar7 = 0;
        }
      } while (sVar1 != 0);
    }
  }
  return bVar6;
}

Assistant:

bool zmq::fq_t::has_in ()
{
    //  There are subsequent parts of the partly-read message available.
    if (_more)
        return true;

    //  Note that messing with current doesn't break the fairness of fair
    //  queueing algorithm. If there are no messages available current will
    //  get back to its original value. Otherwise it'll point to the first
    //  pipe holding messages, skipping only pipes with no messages available.
    while (_active > 0) {
        if (_pipes[_current]->check_read ())
            return true;

        //  Deactivate the pipe.
        _active--;
        _pipes.swap (_current, _active);
        if (_current == _active)
            _current = 0;
    }

    return false;
}